

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::validateKTXcubemapIncomplete
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  byte bVar1;
  uint uVar2;
  int in_EDX;
  byte *in_RSI;
  long in_RDI;
  int popCount;
  uint8_t value;
  uint *in_stack_00000070;
  uint *in_stack_00000078;
  IssueError *in_stack_00000080;
  ValidationContext *in_stack_00000088;
  IssueError *in_stack_00000090;
  ValidationContext *in_stack_00000098;
  IssueWarning *in_stack_00000120;
  ValidationContext *in_stack_00000128;
  
  *(undefined1 *)(in_RDI + 0x112) = 1;
  if (in_EDX != 1) {
    error<unsigned_int&>(in_stack_00000098,in_stack_00000090,(uint *)in_stack_00000088);
  }
  if (in_EDX != 0) {
    bVar1 = *in_RSI;
    if ((in_EDX != 0) && ((bVar1 & 0xc0) != 0)) {
      error<unsigned_char&>(in_stack_00000098,in_stack_00000090,(uchar *)in_stack_00000088);
    }
    uVar2 = popcount<unsigned_char>(bVar1 & 0x3f);
    if (uVar2 == 6) {
      warning<>(in_stack_00000128,in_stack_00000120);
    }
    if (uVar2 == 0) {
      error<>(in_stack_00000088,in_stack_00000080);
    }
    else if (*(uint *)(in_RDI + 0x58) % uVar2 != 0) {
      error<unsigned_int&,int_const&>
                (in_stack_00000088,in_stack_00000080,in_stack_00000078,(int *)in_stack_00000070);
    }
    if (*(int *)(in_RDI + 0x5c) != 1) {
      error<unsigned_int&>(in_stack_00000098,in_stack_00000090,(uint *)in_stack_00000088);
    }
    if (*(int *)(in_RDI + 0x50) != *(int *)(in_RDI + 0x4c)) {
      error<unsigned_int&,unsigned_int&>
                (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
    if (*(int *)(in_RDI + 0x54) != 0) {
      error<unsigned_int&>(in_stack_00000098,in_stack_00000090,(uint *)in_stack_00000088);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateKTXcubemapIncomplete(const uint8_t* data, uint32_t size) {
    foundKTXcubemapIncomplete = true;

    if (size != 1)
        error(Metadata::KTXcubemapIncompleteInvalidSize, size);

    if (size == 0)
        return;

    uint8_t value = *data;

    if (size > 0 && (value & 0b11000000u) != 0)
        error(Metadata::KTXcubemapIncompleteInvalidBitSet, value);
    value = value & 0b00111111u; // Error recovery

    const auto popCount = popcount(value);
    if (popCount == 6)
        warning(Metadata::KTXcubemapIncompleteAllBitsSet);

    if (popCount == 0)
        error(Metadata::KTXcubemapIncompleteNoBitSet);

    if (popCount != 0 && (header.layerCount % popCount != 0))
        error(Metadata::KTXcubemapIncompleteIncompatibleLayerCount, header.layerCount, popCount);

    if (header.faceCount != 1)
        error(Metadata::KTXcubemapIncompleteWithFaceCountNot1, header.faceCount);

    if (header.pixelHeight != header.pixelWidth)
        error(HeaderData::CubeHeightWidthMismatch, header.pixelWidth, header.pixelHeight);

    if (header.pixelDepth != 0)
        error(HeaderData::CubeWithDepth, header.pixelDepth);
}